

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Argument::Clear(Argument *this)

{
  uint32_t cached_has_bits;
  Argument *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Argument_Binding>::Clear
            (&this->arguments_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Argument::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Argument)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  arguments_.Clear();
  _internal_metadata_.Clear<std::string>();
}